

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GetPresenceIndex
          (MessageGenerator *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  pointer ppFVar2;
  LogMessage *pLVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  LogFinisher local_6d;
  int local_6c;
  LogMessage local_68;
  
  bVar1 = IsNullable(descriptor);
  iVar4 = -1;
  if ((!bVar1) && (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x3c) == 2)) {
    ppFVar2 = (this->fields_by_number_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    bVar1 = (this->fields_by_number_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppFVar2;
    iVar4 = local_6c;
    if (bVar1) {
      uVar7 = 0;
      iVar6 = 0;
      do {
        iVar4 = iVar6;
        if (ppFVar2[uVar7] == descriptor) break;
        bVar1 = IsNullable(ppFVar2[uVar7]);
        iVar6 = iVar6 + (uint)!bVar1;
        uVar7 = uVar7 + 1;
        ppFVar2 = (this->fields_by_number_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = (long)(this->fields_by_number_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3;
        bVar1 = uVar7 < uVar5;
        iVar4 = local_6c;
      } while (uVar7 < uVar5);
    }
    local_6c = iVar4;
    iVar4 = local_6c;
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/csharp/csharp_message.cc"
                 ,0x2ba);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_68,"Could not find presence index for field ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,*(string **)descriptor);
      internal::LogFinisher::operator=(&local_6d,pLVar3);
      internal::LogMessage::~LogMessage(&local_68);
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

int MessageGenerator::GetPresenceIndex(const FieldDescriptor* descriptor) {
  if (IsNullable(descriptor) || !IsProto2(descriptor_->file())) {
    return -1;
  }

  int index = 0;
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    if (field == descriptor) {
      return index;
    }
    if (!IsNullable(field)) {
      index++;
    }
  }
  GOOGLE_LOG(DFATAL)<< "Could not find presence index for field " << descriptor->name();
  return -1;
}